

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::ArenaTest_SetAllocatedMessage_Test::~ArenaTest_SetAllocatedMessage_Test
          (ArenaTest_SetAllocatedMessage_Test *this)

{
  ArenaTest_SetAllocatedMessage_Test *this_local;
  
  ~ArenaTest_SetAllocatedMessage_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ArenaTest, SetAllocatedMessage) {
  Arena arena;
  TestAllTypes* arena_message = Arena::Create<TestAllTypes>(&arena);
  TestAllTypes::NestedMessage* nested = new TestAllTypes::NestedMessage;
  nested->set_bb(118);
  arena_message->set_allocated_optional_nested_message(nested);
  EXPECT_EQ(118, arena_message->optional_nested_message().bb());
}